

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O3

AffixPatternMatcher *
icu_63::numparse::impl::AffixPatternMatcher::fromAffixPattern
          (AffixPatternMatcher *__return_storage_ptr__,UnicodeString *affixPattern,
          AffixTokenMatcherWarehouse *tokenWarehouse,parse_flags_t parseFlags,bool *success,
          UErrorCode *status)

{
  AffixPatternMatcherBuilder builder;
  TokenConsumer local_88;
  undefined **local_80;
  MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3> local_78;
  undefined8 local_50;
  UnicodeString *local_48;
  AffixTokenMatcherWarehouse *local_40;
  IgnorablesMatcher *local_38;
  
  if ((ushort)(affixPattern->fUnion).fStackFields.fLengthAndFlags < 0x20) {
    *success = false;
    (__return_storage_ptr__->fPattern).fBuffer.capacity = 0;
    (__return_storage_ptr__->fPattern).fBuffer.needToRelease = '\0';
    (__return_storage_ptr__->fPattern).fBuffer.field_0xd = 0;
    (__return_storage_ptr__->fPattern).fBuffer.stackArray[0] = L'\0';
    *(undefined8 *)((__return_storage_ptr__->fPattern).fBuffer.stackArray + 1) = 0;
    *(undefined8 *)&(__return_storage_ptr__->super_ArraySeriesMatcher).fMatchersLen = 0;
    (__return_storage_ptr__->fPattern).fBuffer.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->super_ArraySeriesMatcher).fMatchers.stackArray[1] =
         (NumberParseMatcher *)0x0;
    (__return_storage_ptr__->super_ArraySeriesMatcher).fMatchers.stackArray[2] =
         (NumberParseMatcher *)0x0;
    (__return_storage_ptr__->super_ArraySeriesMatcher).fMatchers.capacity = 0;
    (__return_storage_ptr__->super_ArraySeriesMatcher).fMatchers.needToRelease = '\0';
    *(undefined3 *)&(__return_storage_ptr__->super_ArraySeriesMatcher).fMatchers.field_0xd = 0;
    (__return_storage_ptr__->super_ArraySeriesMatcher).fMatchers.stackArray[0] =
         (NumberParseMatcher *)0x0;
    (__return_storage_ptr__->super_ArraySeriesMatcher).super_SeriesMatcher.super_CompositionMatcher.
    super_NumberParseMatcher._vptr_NumberParseMatcher = (_func_int **)0x0;
    (__return_storage_ptr__->super_ArraySeriesMatcher).fMatchers.ptr = (NumberParseMatcher **)0x0;
    ArraySeriesMatcher::ArraySeriesMatcher(&__return_storage_ptr__->super_ArraySeriesMatcher);
    (__return_storage_ptr__->super_ArraySeriesMatcher).super_SeriesMatcher.super_CompositionMatcher.
    super_NumberParseMatcher._vptr_NumberParseMatcher =
         (_func_int **)&PTR__AffixPatternMatcher_003f1e20;
    (__return_storage_ptr__->fPattern).fBuffer.ptr =
         (__return_storage_ptr__->fPattern).fBuffer.stackArray;
    (__return_storage_ptr__->fPattern).fBuffer.capacity = 4;
    (__return_storage_ptr__->fPattern).fBuffer.needToRelease = '\0';
    (__return_storage_ptr__->fPattern).fBuffer.stackArray[0] = L'\0';
  }
  else {
    *success = true;
    if (((uint)parseFlags >> 9 & 1) == 0) {
      local_38 = tokenWarehouse->fSetupData->ignorables;
    }
    else {
      local_38 = (IgnorablesMatcher *)0x0;
    }
    local_78.ptr = local_78.stackArray;
    local_88._vptr_TokenConsumer = (_func_int **)&PTR__AffixPatternMatcherBuilder_003f2db8;
    local_80 = &PTR__AffixPatternMatcherBuilder_003f2de8;
    local_78.capacity = 3;
    local_78.needToRelease = '\0';
    local_50 = 0;
    local_48 = affixPattern;
    local_40 = tokenWarehouse;
    icu_63::number::impl::AffixUtils::iterateWithConsumer(affixPattern,&local_88,status);
    AffixPatternMatcher(__return_storage_ptr__,&local_78,(int32_t)local_50,local_48);
    local_88._vptr_TokenConsumer = (_func_int **)&PTR__AffixPatternMatcherBuilder_003f2db8;
    local_80 = &PTR__AffixPatternMatcherBuilder_003f2de8;
    MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::~MaybeStackArray
              (&local_78);
    icu_63::number::impl::TokenConsumer::~TokenConsumer(&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

AffixPatternMatcher AffixPatternMatcher::fromAffixPattern(const UnicodeString& affixPattern,
                                                          AffixTokenMatcherWarehouse& tokenWarehouse,
                                                          parse_flags_t parseFlags, bool* success,
                                                          UErrorCode& status) {
    if (affixPattern.isEmpty()) {
        *success = false;
        return {};
    }
    *success = true;

    IgnorablesMatcher* ignorables;
    if (0 != (parseFlags & PARSE_FLAG_EXACT_AFFIX)) {
        ignorables = nullptr;
    } else {
        ignorables = &tokenWarehouse.ignorables();
    }

    AffixPatternMatcherBuilder builder(affixPattern, tokenWarehouse, ignorables);
    AffixUtils::iterateWithConsumer(affixPattern, builder, status);
    return builder.build();
}